

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O3

void __thiscall Gme_File::Gme_File(Gme_File *this)

{
  uchar *__ptr;
  
  this->_vptr_Gme_File = (_func_int **)&PTR__Gme_File_00892be0;
  (this->file_data).begin_ = (uchar *)0x0;
  (this->file_data).size_ = 0;
  this->type_ = (gme_type_t)0x0;
  this->user_data_ = (void *)0x0;
  this->user_cleanup_ = (gme_user_cleanup_t)0x0;
  (this->playlist).entries.begin_ = (entry_t *)0x0;
  (this->playlist).entries.size_ = 0;
  (this->playlist).data.begin_ = (char *)0x0;
  (this->playlist).data.size_ = 0;
  clear_playlist(this);
  this->track_count_ = 0;
  this->raw_track_count_ = 0;
  __ptr = (this->file_data).begin_;
  (this->file_data).begin_ = (uchar *)0x0;
  (this->file_data).size_ = 0;
  free(__ptr);
  return;
}

Assistant:

Gme_File::Gme_File()
{
	type_         = 0;
	user_data_    = 0;
	user_cleanup_ = 0;
	unload(); // clears fields
	blargg_verify_byte_order(); // used by most emulator types, so save them the trouble
}